

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink-inl.h
# Opt level: O3

void __thiscall
spdlog::sinks::base_sink<std::mutex>::set_pattern_(base_sink<std::mutex> *this,string *pattern)

{
  _Alloc_hider local_20;
  long *local_18;
  
  std::make_unique<spdlog::pattern_formatter,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20);
  local_18 = (long *)local_20._M_p;
  local_20._M_p = (pointer)0x0;
  (*(this->super_sink)._vptr_sink[9])(this);
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  local_18 = (long *)0x0;
  if ((pattern_formatter *)local_20._M_p != (pattern_formatter *)0x0) {
    std::default_delete<spdlog::pattern_formatter>::operator()
              ((default_delete<spdlog::pattern_formatter> *)&local_20,
               (pattern_formatter *)local_20._M_p);
  }
  return;
}

Assistant:

void SPDLOG_INLINE spdlog::sinks::base_sink<Mutex>::set_pattern_(const std::string &pattern) {
    set_formatter_(details::make_unique<spdlog::pattern_formatter>(pattern));
}